

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_mvcs(CPUS390XState_conflict *env,uint64_t l,uint64_t a1,uint64_t a2)

{
  uint32_t uVar1;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  S390Access local_80;
  S390Access local_58;
  
  uVar2 = (env->psw).mask;
  if ((((uVar2 >> 0x3a & 1) == 0) || ((uVar2 >> 0x2e & 1) != 0)) ||
     ((env->cregs[0] & 0x4000000) == 0)) {
    s390_program_interrupt(env,0x13,unaff_retaddr);
  }
  uVar2 = l & 0xffffffff;
  if (((env->psw).mask & 0x100000000) != 0) {
    uVar2 = l;
  }
  if (uVar2 < 0x101) {
    uVar1 = 0;
    if (uVar2 == 0) {
      return 0;
    }
  }
  else {
    uVar1 = 3;
    uVar2 = 0x100;
  }
  access_prepare(&local_80,env,a2,(int)uVar2,MMU_DATA_LOAD,0,unaff_retaddr);
  access_prepare(&local_58,env,a1,(int)uVar2,MMU_DATA_STORE,1,unaff_retaddr);
  access_memmove(env,&local_58,&local_80,unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t HELPER(mvcs)(CPUS390XState *env, uint64_t l, uint64_t a1, uint64_t a2)
{
    const uint8_t psw_as = (env->psw.mask & PSW_MASK_ASC) >> PSW_SHIFT_ASC;
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int cc = 0;

    HELPER_LOG("%s: %16" PRIx64 " %16" PRIx64 " %16" PRIx64 "\n",
               __func__, l, a1, a2);

    if (!(env->psw.mask & PSW_MASK_DAT) || !(env->cregs[0] & CR0_SECONDARY) ||
        psw_as == AS_HOME || psw_as == AS_ACCREG) {
        s390_program_interrupt(env, PGM_SPECIAL_OP, ra);
    }

    l = wrap_length32(env, l);
    if (l > 256) {
        /* max 256 */
        l = 256;
        cc = 3;
    } else if (!l) {
        return cc;
    }

    /* TODO: Access key handling */
    srca = access_prepare(env, a2, l, MMU_DATA_LOAD, MMU_PRIMARY_IDX, ra);
    desta = access_prepare(env, a1, l, MMU_DATA_STORE, MMU_SECONDARY_IDX, ra);
    access_memmove(env, &desta, &srca, ra);
    return cc;
}